

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O0

void __thiscall
Assimp::SpatialSort::SpatialSort
          (SpatialSort *this,aiVector3D *pPositions,uint pNumPositions,uint pElementOffset)

{
  uint pElementOffset_local;
  uint pNumPositions_local;
  aiVector3D *pPositions_local;
  SpatialSort *this_local;
  
  aiVector3t<float>::aiVector3t(&this->mPlaneNormal,0.8523,0.34321,0.5736);
  std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::vector
            (&this->mPositions);
  aiVector3t<float>::Normalize(&this->mPlaneNormal);
  Fill(this,pPositions,pNumPositions,pElementOffset,true);
  return;
}

Assistant:

SpatialSort::SpatialSort( const aiVector3D* pPositions, unsigned int pNumPositions,
    unsigned int pElementOffset)

    // define the reference plane. We choose some arbitrary vector away from all basic axises
    // in the hope that no model spreads all its vertices along this plane.
    : mPlaneNormal(0.8523f, 0.34321f, 0.5736f)
{
    mPlaneNormal.Normalize();
    Fill(pPositions,pNumPositions,pElementOffset);
}